

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O2

uint16_t __thiscall
icu_63::Normalizer2Impl::previousFCD16(Normalizer2Impl *this,UChar *start,UChar **s)

{
  UChar UVar1;
  UChar *pUVar2;
  UBool UVar3;
  uint16_t uVar4;
  uint c;
  
  pUVar2 = *s;
  *s = pUVar2 + -1;
  UVar1 = pUVar2[-1];
  c = (uint)(ushort)UVar1;
  if ((ushort)UVar1 < (ushort)this->minDecompNoCP) {
    return 0;
  }
  if ((c & 0xfc00) == 0xdc00) {
    if ((start < pUVar2 + -1) && ((pUVar2[-2] & 0xfc00U) == 0xd800)) {
      c = (uint)(ushort)UVar1 + (uint)(ushort)pUVar2[-2] * 0x400 + 0xfca02400;
      *s = pUVar2 + -2;
    }
  }
  else {
    UVar3 = singleLeadMightHaveNonZeroFCD16(this,(uint)(ushort)UVar1);
    if (UVar3 == '\0') {
      return 0;
    }
  }
  uVar4 = getFCD16FromNormData(this,c);
  return uVar4;
}

Assistant:

uint16_t previousFCD16(const UChar *start, const UChar *&s) const {
        UChar32 c=*--s;
        if(c<minDecompNoCP) {
            return 0;
        }
        if(!U16_IS_TRAIL(c)) {
            if(!singleLeadMightHaveNonZeroFCD16(c)) {
                return 0;
            }
        } else {
            UChar c2;
            if(start<s && U16_IS_LEAD(c2=*(s-1))) {
                c=U16_GET_SUPPLEMENTARY(c2, c);
                --s;
            }
        }
        return getFCD16FromNormData(c);
    }